

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O2

string * __thiscall
pbrt::DielectricMaterial::ToString_abi_cxx11_
          (string *__return_storage_ptr__,DielectricMaterial *this)

{
  bool *unaff_RBX;
  
  StringPrintf<pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,bool_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ DielectricMaterial displacement: %s uRoughness: %s vRoughness: %s etaF: %s etaS: %s remapRoughness: %s ]"
             ,(char *)this,&this->uRoughness,&this->vRoughness,&this->etaF,
             (FloatTextureHandle *)&this->etaS,(SpectrumTextureHandle *)&this->remapRoughness,
             unaff_RBX);
  return __return_storage_ptr__;
}

Assistant:

std::string DielectricMaterial::ToString() const {
    return StringPrintf("[ DielectricMaterial displacement: %s uRoughness: %s "
                        "vRoughness: %s etaF: %s "
                        "etaS: %s remapRoughness: %s ]",
                        displacement, uRoughness, vRoughness, etaF, etaS, remapRoughness);
}